

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void SetActorAngle(AActor *activator,int tid,int angle,bool interpolate)

{
  AActor *this;
  DAngle local_30;
  DAngle local_28;
  
  local_28.Degrees = (double)angle * 0.0054931640625;
  if (tid == 0) {
    if (activator != (AActor *)0x0) {
      AActor::SetAngle(activator,&local_28,interpolate);
    }
  }
  else {
    this = AActor::TIDHash[tid & 0x7f];
    if (this != (AActor *)0x0) {
      do {
        if (this->tid == tid) {
          local_30.Degrees = local_28.Degrees;
          AActor::SetAngle(this,&local_30,interpolate);
        }
        this = this->inext;
      } while (this != (AActor *)0x0);
    }
  }
  return;
}

Assistant:

inline DAngle ACSToAngle(int acsval)
{
	return acsval * (360. / 65536.);
}